

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O1

void __thiscall
HTTPWorkItem::HTTPWorkItem
          (HTTPWorkItem *this,unique_ptr<HTTPRequest,_std::default_delete<HTTPRequest>_> _req,
          string *_path,HTTPRequestHandler *_func)

{
  long lVar1;
  pointer pcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_HTTPClosure)._vptr_HTTPClosure = (_func_int **)&PTR_operator___00b3a948;
  (this->req)._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>._M_t.
  super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
  super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl =
       *(HTTPRequest **)
        _req._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>._M_t.
        super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
        super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl;
  *(undefined8 *)
   _req._M_t.super___uniq_ptr_impl<HTTPRequest,_std::default_delete<HTTPRequest>_>._M_t.
   super__Tuple_impl<0UL,_HTTPRequest_*,_std::default_delete<HTTPRequest>_>.
   super__Head_base<0UL,_HTTPRequest_*,_false>._M_head_impl = 0;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  pcVar2 = (_path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->path,pcVar2,pcVar2 + _path->_M_string_length);
  std::
  function<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->func,_func);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

HTTPWorkItem(std::unique_ptr<HTTPRequest> _req, const std::string &_path, const HTTPRequestHandler& _func):
        req(std::move(_req)), path(_path), func(_func)
    {
    }